

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::PatternMatcher::PatternMatcher
          (PatternMatcher *this,string *designation,Module *module,Split *list)

{
  string_view str;
  Name name_00;
  char *pcVar1;
  bool bVar2;
  mapped_type *this_00;
  long lVar3;
  ostream *poVar4;
  Fatal *pFVar5;
  char *pcVar6;
  char *extraout_RDX;
  Name NVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  Name name_01;
  Name local_298;
  char local_281;
  Fatal local_280;
  ostream *local_f8;
  size_t sStack_f0;
  ostream *local_e8;
  size_t sStack_e0;
  Function *local_d0;
  Function *func;
  undefined1 local_c0;
  string local_b8;
  string local_98;
  Name local_68;
  undefined1 auStack_58 [8];
  Name escaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  const_iterator __end2;
  const_iterator __begin2;
  Split *__range2;
  Split *list_local;
  Module *module_local;
  string *designation_local;
  PatternMatcher *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)designation);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->names);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->patterns);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->patternsMatched);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->unescaped);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&list->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&list->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&name);
    if (!bVar2) {
      return;
    }
    escaped.super_IString.str._M_str =
         (char *)__gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
    wasm::Name::Name(&local_68,(string *)escaped.super_IString.str._M_str);
    NVar7.super_IString.str._M_str = extraout_RDX;
    NVar7.super_IString.str._M_len = (size_t)local_68.super_IString.str._M_str;
    NVar7 = WasmBinaryReader::escape((WasmBinaryReader *)local_68.super_IString.str._M_len,NVar7);
    pcVar1 = escaped.super_IString.str._M_str;
    escaped.super_IString.str._M_len = NVar7.super_IString.str._M_str;
    auStack_58 = NVar7.super_IString.str._M_len;
    pcVar6 = escaped.super_IString.str._M_str;
    IString::toString_abi_cxx11_(&local_98,(IString *)auStack_58);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->unescaped,&local_98);
    std::__cxx11::string::operator=((string *)this_00,(string *)pcVar1);
    std::__cxx11::string::~string((string *)&local_98);
    lVar3 = std::__cxx11::string::find((char)escaped.super_IString.str._M_str,0x2a);
    if (lVar3 == -1) {
      local_e8 = (ostream *)auStack_58;
      sStack_e0 = escaped.super_IString.str._M_len;
      name_00.super_IString.str._M_str = (char *)escaped.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)auStack_58;
      local_d0 = Module::getFunctionOrNull(module,name_00);
      if (local_d0 == (Function *)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"warning: Asyncify ");
        poVar4 = std::operator<<(poVar4,(string *)designation);
        poVar4 = std::operator<<(poVar4,"list contained a non-existing function name: ");
        poVar4 = std::operator<<(poVar4,(string *)escaped.super_IString.str._M_str);
        poVar4 = std::operator<<(poVar4," (");
        local_f8 = (ostream *)auStack_58;
        sStack_f0 = escaped.super_IString.str._M_len;
        name_01.super_IString.str._M_str = pcVar6;
        name_01.super_IString.str._M_len = escaped.super_IString.str._M_len;
        poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)auStack_58,name_01);
        std::operator<<(poVar4,")\n");
      }
      else {
        bVar2 = Importable::imported(&local_d0->super_Importable);
        if (bVar2) {
          Fatal::Fatal(&local_280);
          pFVar5 = Fatal::operator<<(&local_280,(char (*) [10])0x28d90ec);
          pFVar5 = Fatal::operator<<(pFVar5,designation);
          pFVar5 = Fatal::operator<<(pFVar5,(char (*) [77])
                                            "list contained an imported function name (use the import list for imports): "
                                    );
          pFVar5 = Fatal::operator<<(pFVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)escaped.super_IString.str._M_str);
          local_281 = '\n';
          Fatal::operator<<(pFVar5,&local_281);
          Fatal::~Fatal(&local_280);
        }
      }
      str._M_str = (char *)escaped.super_IString.str._M_len;
      str._M_len = (size_t)auStack_58;
      wasm::Name::Name(&local_298,str);
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                (&this->names,&local_298);
    }
    else {
      IString::toString_abi_cxx11_(&local_b8,(IString *)auStack_58);
      pVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->patterns,&local_b8);
      func = (Function *)pVar8.first._M_node;
      local_c0 = pVar8.second;
      std::__cxx11::string::~string((string *)&local_b8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

PatternMatcher(std::string designation,
                 Module& module,
                 const String::Split& list)
    : designation(designation) {
    // The lists contain human-readable strings. Turn them into the
    // internal escaped names for later comparisons
    for (auto& name : list) {
      auto escaped = WasmBinaryReader::escape(name);
      unescaped[escaped.toString()] = name;
      if (name.find('*') != std::string::npos) {
        patterns.insert(escaped.toString());
      } else {
        auto* func = module.getFunctionOrNull(escaped);
        if (!func) {
          std::cerr << "warning: Asyncify " << designation
                    << "list contained a non-existing function name: " << name
                    << " (" << escaped << ")\n";
        } else if (func->imported()) {
          Fatal() << "Asyncify " << designation
                  << "list contained an imported function name (use the import "
                     "list for imports): "
                  << name << '\n';
        }
        names.insert(escaped.str);
      }
    }
  }